

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_mutex *p;
  int rc;
  sqlite3_mutex *mutex;
  sqlite3_vfs *pVfs_local;
  
  pVfs_local._4_4_ = sqlite3_initialize();
  if (pVfs_local._4_4_ == 0) {
    p = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(p);
    vfsUnlink(pVfs);
    sqlite3_mutex_leave(p);
    pVfs_local._4_4_ = 0;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}